

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::FBXConverter::SetShadingPropertiesCommon
          (FBXConverter *this,aiMaterial *out_mat,PropertyTable *props)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Property *pPVar3;
  long lVar4;
  char *pcVar5;
  PropertyTable *pPVar6;
  float *pInput;
  bool ok;
  float CalculatedOpacity;
  float DispFactor;
  float BumpFactor;
  float ReflectionFactor;
  float Opacity;
  float TransparencyFactor;
  float ShininessExponent;
  float SpecularFactor;
  char local_c5;
  float local_c4;
  string local_c0;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  undefined1 local_80 [36];
  undefined1 local_5c [8];
  float local_54;
  undefined1 local_50 [24];
  undefined1 local_38 [24];
  
  paVar1 = &local_c0.field_2;
  pcVar5 = "Diffuse";
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Diffuse","");
  GetColorPropertyFromMaterial
            ((FBXConverter *)(local_38 + 0xc),(PropertyTable *)pcVar5,(string *)props,
             (bool *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_c5 == '\x01') {
    aiMaterial::AddBinaryProperty(out_mat,local_38 + 0xc,0xc,"$clr.diffuse",0,0,aiPTI_Float);
  }
  pcVar5 = "Emissive";
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Emissive","");
  GetColorPropertyFromMaterial
            ((FBXConverter *)local_38,(PropertyTable *)pcVar5,(string *)props,(bool *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_c5 == '\x01') {
    aiMaterial::AddBinaryProperty(out_mat,local_38,0xc,"$clr.emissive",0,0,aiPTI_Float);
  }
  pPVar6 = (PropertyTable *)0x6d4de8;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Ambient","");
  GetColorPropertyFromMaterial
            ((FBXConverter *)(local_50 + 0xc),pPVar6,(string *)props,(bool *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_c5 == '\x01') {
    aiMaterial::AddBinaryProperty(out_mat,local_50 + 0xc,0xc,"$clr.ambient",0,0,aiPTI_Float);
  }
  pPVar6 = (PropertyTable *)0x6f0e2c;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"SpecularColor","");
  GetColorProperty((FBXConverter *)local_50,pPVar6,(string *)props,(bool *)&local_c0,
                   SUB81(&local_c5,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_c5 == '\x01') {
    aiMaterial::AddBinaryProperty(out_mat,local_50,0xc,"$clr.specular",0,0,aiPTI_Float);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"SpecularFactor","");
  pPVar3 = PropertyTable::Get(props,&local_c0);
  if (pPVar3 == (Property *)0x0) {
    pPVar6 = (props->templateProps).
             super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (pPVar6 == (PropertyTable *)0x0) {
LAB_00570262:
      local_c5 = '\0';
      bVar2 = false;
      pPVar3 = (Property *)0x0;
    }
    else {
      pPVar3 = PropertyTable::Get(pPVar6,&local_c0);
      if (pPVar3 == (Property *)0x0) goto LAB_00570262;
      bVar2 = true;
    }
    local_84 = 0.0;
    if (bVar2) goto LAB_00570272;
  }
  else {
LAB_00570272:
    lVar4 = __dynamic_cast(pPVar3,&Property::typeinfo,&TypedProperty<float>::typeinfo,0);
    if (lVar4 == 0) {
      local_c5 = '\0';
      local_84 = 0.0;
    }
    else {
      local_c5 = '\x01';
      local_84 = *(float *)(lVar4 + 8);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    local_c4 = local_84;
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    local_84 = local_c4;
  }
  if (local_c5 == '\x01') {
    aiMaterial::AddBinaryProperty(out_mat,&local_84,4,"$mat.shinpercent",0,0,aiPTI_Float);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"ShininessExponent","");
  pPVar3 = PropertyTable::Get(props,&local_c0);
  if (pPVar3 == (Property *)0x0) {
LAB_0057034f:
    local_c5 = '\0';
    local_88 = 0.0;
  }
  else {
    lVar4 = __dynamic_cast(pPVar3,&Property::typeinfo,&TypedProperty<float>::typeinfo,0);
    if (lVar4 == 0) goto LAB_0057034f;
    local_c5 = '\x01';
    local_88 = *(float *)(lVar4 + 8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    local_c4 = local_88;
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    local_88 = local_c4;
  }
  if (local_c5 == '\x01') {
    aiMaterial::AddBinaryProperty(out_mat,&local_88,4,"$mat.shininess",0,0,aiPTI_Float);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"TransparentColor","");
  pcVar5 = "TransparencyFactor";
  local_80._0_8_ = local_80 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"TransparencyFactor","");
  GetColorPropertyFactored
            ((FBXConverter *)local_5c,(PropertyTable *)pcVar5,(string *)props,&local_c0,
             (bool *)local_80,SUB81(&local_c5,0));
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_a0 = 1.0;
  if (local_c5 == '\x01') {
    aiMaterial::AddBinaryProperty(out_mat,local_5c,0xc,"$clr.transparent",0,0,aiPTI_Float);
    local_a0 = ((float)local_5c._0_4_ + (float)local_5c._4_4_ + local_54) / -3.0 + 1.0;
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"TransparencyFactor","");
  pPVar3 = PropertyTable::Get(props,&local_c0);
  if (pPVar3 == (Property *)0x0) {
LAB_005704ef:
    local_c5 = '\0';
    local_8c = 0.0;
  }
  else {
    lVar4 = __dynamic_cast(pPVar3,&Property::typeinfo,&TypedProperty<float>::typeinfo,0);
    if (lVar4 == 0) goto LAB_005704ef;
    local_c5 = '\x01';
    local_8c = *(float *)(lVar4 + 8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    local_c4 = local_8c;
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    local_8c = local_c4;
  }
  if (local_c5 == '\x01') {
    aiMaterial::AddBinaryProperty(out_mat,&local_8c,4,"$mat.transparencyfactor",0,0,aiPTI_Float);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Opacity","");
  pPVar3 = PropertyTable::Get(props,&local_c0);
  if (pPVar3 == (Property *)0x0) {
LAB_005705a3:
    local_c5 = '\0';
    local_90 = 0.0;
  }
  else {
    lVar4 = __dynamic_cast(pPVar3,&Property::typeinfo,&TypedProperty<float>::typeinfo,0);
    if (lVar4 == 0) goto LAB_005705a3;
    local_c5 = '\x01';
    local_90 = *(float *)(lVar4 + 8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    local_c4 = local_90;
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    local_90 = local_c4;
  }
  if (local_c5 == '\0') {
    if ((local_a0 != 1.0) || (NAN(local_a0))) {
      pInput = &local_a0;
      goto LAB_005705f8;
    }
  }
  else {
    pInput = &local_90;
LAB_005705f8:
    aiMaterial::AddBinaryProperty(out_mat,pInput,4,"$mat.opacity",0,0,aiPTI_Float);
  }
  pcVar5 = "ReflectionColor";
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"ReflectionColor","");
  GetColorProperty((FBXConverter *)local_80,(PropertyTable *)pcVar5,(string *)props,
                   (bool *)&local_c0,SUB81(&local_c5,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_c5 == '\x01') {
    aiMaterial::AddBinaryProperty(out_mat,local_80,0xc,"$clr.reflective",0,0,aiPTI_Float);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"ReflectionFactor","");
  pPVar3 = PropertyTable::Get(props,&local_c0);
  if (pPVar3 == (Property *)0x0) {
    pPVar6 = (props->templateProps).
             super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (pPVar6 == (PropertyTable *)0x0) {
LAB_005706de:
      local_c5 = '\0';
      bVar2 = false;
      pPVar3 = (Property *)0x0;
    }
    else {
      pPVar3 = PropertyTable::Get(pPVar6,&local_c0);
      if (pPVar3 == (Property *)0x0) goto LAB_005706de;
      bVar2 = true;
    }
    local_94 = 0.0;
    if (bVar2) goto LAB_005706ee;
  }
  else {
LAB_005706ee:
    lVar4 = __dynamic_cast(pPVar3,&Property::typeinfo,&TypedProperty<float>::typeinfo,0);
    if (lVar4 == 0) {
      local_c5 = '\0';
      local_94 = 0.0;
    }
    else {
      local_c5 = '\x01';
      local_94 = *(float *)(lVar4 + 8);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    local_c4 = local_94;
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    local_94 = local_c4;
  }
  if (local_c5 == '\x01') {
    aiMaterial::AddBinaryProperty(out_mat,&local_94,4,"$mat.reflectivity",0,0,aiPTI_Float);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"BumpFactor","");
  pPVar3 = PropertyTable::Get(props,&local_c0);
  if (pPVar3 == (Property *)0x0) {
LAB_005707cb:
    local_c5 = '\0';
    local_98 = 0.0;
  }
  else {
    lVar4 = __dynamic_cast(pPVar3,&Property::typeinfo,&TypedProperty<float>::typeinfo,0);
    if (lVar4 == 0) goto LAB_005707cb;
    local_c5 = '\x01';
    local_98 = *(float *)(lVar4 + 8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    local_c4 = local_98;
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    local_98 = local_c4;
  }
  if (local_c5 == '\x01') {
    aiMaterial::AddBinaryProperty(out_mat,&local_98,4,"$mat.bumpscaling",0,0,aiPTI_Float);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"DisplacementFactor","");
  pPVar3 = PropertyTable::Get(props,&local_c0);
  if (pPVar3 != (Property *)0x0) {
    lVar4 = __dynamic_cast(pPVar3,&Property::typeinfo,&TypedProperty<float>::typeinfo,0);
    if (lVar4 != 0) {
      local_c5 = '\x01';
      local_9c = *(float *)(lVar4 + 8);
      goto LAB_00570887;
    }
  }
  local_c5 = '\0';
  local_9c = 0.0;
LAB_00570887:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    local_c4 = local_9c;
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    local_9c = local_c4;
  }
  if (local_c5 == '\x01') {
    aiMaterial::AddBinaryProperty(out_mat,&local_9c,4,"$mat.displacementscaling",0,0,aiPTI_Float);
  }
  return;
}

Assistant:

void FBXConverter::SetShadingPropertiesCommon(aiMaterial* out_mat, const PropertyTable& props)
        {
            // Set shading properties.
            // Modern FBX Files have two separate systems for defining these,
            // with only the more comprehensive one described in the property template.
            // Likely the other values are a legacy system,
            // which is still always exported by the official FBX SDK.
            //
            // Blender's FBX import and export mostly ignore this legacy system,
            // and as we only support recent versions of FBX anyway, we can do the same.
            bool ok;

            const aiColor3D& Diffuse = GetColorPropertyFromMaterial(props, "Diffuse", ok);
            if (ok) {
                out_mat->AddProperty(&Diffuse, 1, AI_MATKEY_COLOR_DIFFUSE);
            }

            const aiColor3D& Emissive = GetColorPropertyFromMaterial(props, "Emissive", ok);
            if (ok) {
                out_mat->AddProperty(&Emissive, 1, AI_MATKEY_COLOR_EMISSIVE);
            }

            const aiColor3D& Ambient = GetColorPropertyFromMaterial(props, "Ambient", ok);
            if (ok) {
                out_mat->AddProperty(&Ambient, 1, AI_MATKEY_COLOR_AMBIENT);
            }

            // we store specular factor as SHININESS_STRENGTH, so just get the color
            const aiColor3D& Specular = GetColorProperty(props, "SpecularColor", ok, true);
            if (ok) {
                out_mat->AddProperty(&Specular, 1, AI_MATKEY_COLOR_SPECULAR);
            }

            // and also try to get SHININESS_STRENGTH
            const float SpecularFactor = PropertyGet<float>(props, "SpecularFactor", ok, true);
            if (ok) {
                out_mat->AddProperty(&SpecularFactor, 1, AI_MATKEY_SHININESS_STRENGTH);
            }

            // and the specular exponent
            const float ShininessExponent = PropertyGet<float>(props, "ShininessExponent", ok);
            if (ok) {
                out_mat->AddProperty(&ShininessExponent, 1, AI_MATKEY_SHININESS);
            }

            // TransparentColor / TransparencyFactor... gee thanks FBX :rolleyes:
            const aiColor3D& Transparent = GetColorPropertyFactored(props, "TransparentColor", "TransparencyFactor", ok);
            float CalculatedOpacity = 1.0f;
            if (ok) {
                out_mat->AddProperty(&Transparent, 1, AI_MATKEY_COLOR_TRANSPARENT);
                // as calculated by FBX SDK 2017:
                CalculatedOpacity = 1.0f - ((Transparent.r + Transparent.g + Transparent.b) / 3.0f);
            }

            // try to get the transparency factor
            const float TransparencyFactor = PropertyGet<float>(props, "TransparencyFactor", ok);
            if (ok) {
                out_mat->AddProperty(&TransparencyFactor, 1, AI_MATKEY_TRANSPARENCYFACTOR);
            }

            // use of TransparencyFactor is inconsistent.
            // Maya always stores it as 1.0,
            // so we can't use it to set AI_MATKEY_OPACITY.
            // Blender is more sensible and stores it as the alpha value.
            // However both the FBX SDK and Blender always write an additional
            // legacy "Opacity" field, so we can try to use that.
            //
            // If we can't find it,
            // we can fall back to the value which the FBX SDK calculates
            // from transparency colour (RGB) and factor (F) as
            // 1.0 - F*((R+G+B)/3).
            //
            // There's no consistent way to interpret this opacity value,
            // so it's up to clients to do the correct thing.
            const float Opacity = PropertyGet<float>(props, "Opacity", ok);
            if (ok) {
                out_mat->AddProperty(&Opacity, 1, AI_MATKEY_OPACITY);
            }
            else if (CalculatedOpacity != 1.0) {
                out_mat->AddProperty(&CalculatedOpacity, 1, AI_MATKEY_OPACITY);
            }

            // reflection color and factor are stored separately
            const aiColor3D& Reflection = GetColorProperty(props, "ReflectionColor", ok, true);
            if (ok) {
                out_mat->AddProperty(&Reflection, 1, AI_MATKEY_COLOR_REFLECTIVE);
            }

            float ReflectionFactor = PropertyGet<float>(props, "ReflectionFactor", ok, true);
            if (ok) {
                out_mat->AddProperty(&ReflectionFactor, 1, AI_MATKEY_REFLECTIVITY);
            }

            const float BumpFactor = PropertyGet<float>(props, "BumpFactor", ok);
            if (ok) {
                out_mat->AddProperty(&BumpFactor, 1, AI_MATKEY_BUMPSCALING);
            }

            const float DispFactor = PropertyGet<float>(props, "DisplacementFactor", ok);
            if (ok) {
                out_mat->AddProperty(&DispFactor, 1, "$mat.displacementscaling", 0, 0);
    }
}